

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O1

bool ComputeIk(IkReal *eetrans,IkReal *eerot,IkReal *pfree,IkSolutionListBase<double> *solutions)

{
  long lVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  IkReal *pIVar5;
  ulong uVar6;
  double *q_sols_00;
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  vinfos;
  double T [16];
  double q_sols [48];
  allocator_type local_26d;
  uint local_26c;
  void *local_268;
  undefined8 uStack_260;
  long local_258;
  vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
  local_250;
  double local_238;
  IkReal aIStack_230 [15];
  double local_1b8 [49];
  
  if (pfree == (IkReal *)0x0) {
    bVar3 = false;
  }
  else {
    pIVar5 = eerot + 2;
    lVar1 = 0;
    do {
      *(IkReal *)((long)&local_238 + lVar1 * 4) = pIVar5[-2];
      *(IkReal *)((long)aIStack_230 + lVar1 * 4) = pIVar5[-1];
      *(IkReal *)((long)aIStack_230 + lVar1 * 4 + 8) = *pIVar5;
      *(undefined8 *)((long)aIStack_230 + lVar1 * 4 + 0x10) = *(undefined8 *)((long)eetrans + lVar1)
      ;
      lVar1 = lVar1 + 8;
      pIVar5 = pIVar5 + 3;
    } while (lVar1 != 0x18);
    aIStack_230[0xb] = 0.0;
    aIStack_230[0xc] = 0.0;
    aIStack_230[0xd] = 0.0;
    aIStack_230[0xe] = 1.0;
    q_sols_00 = local_1b8;
    local_26c = ur_kinematics::inverse(&local_238,q_sols_00,*pfree);
    local_258 = 0;
    local_268 = (void *)0x0;
    uStack_260 = 0;
    if (0 < (int)local_26c) {
      uVar4 = (ulong)local_26c;
      uVar6 = 0;
      do {
        std::
        vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
        ::vector(&local_250,6,&local_26d);
        pdVar2 = &(local_250.
                   super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->foffset;
        lVar1 = 0;
        do {
          *pdVar2 = q_sols_00[lVar1];
          lVar1 = lVar1 + 1;
          pdVar2 = pdVar2 + 3;
        } while (lVar1 != 6);
        (*solutions->_vptr_IkSolutionListBase[2])(solutions,&local_250,&local_268);
        if (local_250.
            super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_250.
                          super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_250.
                                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_250.
                                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar6 = uVar6 + 1;
        q_sols_00 = q_sols_00 + 6;
      } while (uVar6 != uVar4);
    }
    bVar3 = 0 < (int)local_26c;
    if (local_268 != (void *)0x0) {
      operator_delete(local_268,local_258 - (long)local_268);
    }
  }
  return bVar3;
}

Assistant:

IKFAST_API bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
  if(!pfree) return false;

  int n = GetNumJoints();
  double q_sols[8*6];
  double T[16];

  to_mat44(T, eetrans, eerot);

  int num_sols = ur_kinematics::inverse(T, q_sols,pfree[0]);

  std::vector<int> vfree(0);

  for (int i=0; i < num_sols; ++i){
    std::vector<IkSingleDOFSolutionBase<IkReal> > vinfos(n);
    for (int j=0; j < n; ++j) vinfos[j].foffset = q_sols[i*n+j];
    solutions.AddSolution(vinfos,vfree);
  }
  return num_sols > 0;
}